

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_open(archive *_a,void *client_data,undefined1 *opener,
                      archive_write_callback *writer,undefined1 *closer)

{
  int iVar1;
  archive_write_filter *paVar2;
  int local_58;
  int magic_test;
  int r1;
  int ret;
  archive_write_filter *client_filter;
  archive_write *a;
  undefined1 *closer_local;
  archive_write_callback *writer_local;
  undefined1 *opener_local;
  void *client_data_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_open");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    archive_clear_error(_a);
    *(archive_write_callback **)&_a[1].file_count = writer;
    _a[1].compression_name = opener;
    _a[1].error = closer;
    _a[1].error_string.s = (char *)client_data;
    paVar2 = __archive_write_allocate_filter(_a);
    paVar2->open = archive_write_client_open;
    paVar2->write = archive_write_client_write;
    paVar2->close = archive_write_client_close;
    local_58 = __archive_write_open_filter((archive_write_filter *)_a[1].error_string.buffer_length)
    ;
    if (local_58 < -0x14) {
      iVar1 = __archive_write_close_filter((archive_write_filter *)_a[1].error_string.buffer_length)
      ;
      if (iVar1 < local_58) {
        local_58 = iVar1;
      }
      _a_local._4_4_ = local_58;
    }
    else {
      _a->state = 2;
      magic_test = local_58;
      if (_a[1].read_data_block != (char *)0x0) {
        magic_test = (*(code *)_a[1].read_data_block)(_a);
      }
      _a_local._4_4_ = magic_test;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_open(struct archive *_a, void *client_data,
    archive_open_callback *opener, archive_write_callback *writer,
    archive_close_callback *closer)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *client_filter;
	int ret, r1;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_open");
	archive_clear_error(&a->archive);

	a->client_writer = writer;
	a->client_opener = opener;
	a->client_closer = closer;
	a->client_data = client_data;

	client_filter = __archive_write_allocate_filter(_a);
	client_filter->open = archive_write_client_open;
	client_filter->write = archive_write_client_write;
	client_filter->close = archive_write_client_close;

	ret = __archive_write_open_filter(a->filter_first);
	if (ret < ARCHIVE_WARN) {
		r1 = __archive_write_close_filter(a->filter_first);
		return (r1 < ret ? r1 : ret);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;
	if (a->format_init)
		ret = (a->format_init)(a);
	return (ret);
}